

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall
Search::search::set_label_parser(search *this,label_parser *lp,_func_bool_polylabel_ptr *is_test)

{
  ostream *poVar1;
  vw *pvVar2;
  long lVar3;
  label_parser *plVar4;
  byte bVar5;
  
  bVar5 = 0;
  pvVar2 = this->priv->all;
  if ((pvVar2->vw_is_main == true) && (this->priv->state != INITIALIZE)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "warning: task should not set label parser except in initialize function!"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    pvVar2 = this->priv->all;
  }
  plVar4 = &pvVar2->p->lp;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    plVar4->default_label = lp->default_label;
    lp = (label_parser *)((long)lp + (ulong)bVar5 * -0x10 + 8);
    plVar4 = (label_parser *)((long)plVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  (this->priv->all->p->lp).test_label = (_func_bool_void_ptr *)is_test;
  this->priv->label_is_test = is_test;
  return;
}

Assistant:

void search::set_label_parser(label_parser& lp, bool (*is_test)(polylabel&))
{
  if (this->priv->all->vw_is_main && (this->priv->state != INITIALIZE))
    std::cerr << "warning: task should not set label parser except in initialize function!" << endl;
  this->priv->all->p->lp = lp;
  this->priv->all->p->lp.test_label = (bool (*)(void*))is_test;
  this->priv->label_is_test = is_test;
}